

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::ModuleBase::ModuleBase
          (ModuleBase *this,ObjectType ot,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  char *pcVar1;
  
  ASTObject::ASTObject(&this->super_ASTObject,ot,processorName);
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__ModuleBase_002f68a0;
  (this->super_Scope)._vptr_Scope = (_func_int **)&PTR__ModuleBase_002f6950;
  pcVar1 = (processorKeyword->location).data;
  (this->processorKeywordLocation).sourceCode.object = (processorKeyword->sourceCode).object;
  (this->processorKeywordLocation).location.data = pcVar1;
  (processorKeyword->sourceCode).object = (SourceCodeText *)0x0;
  (this->name).name = moduleName.name;
  this->isFullyResolved = false;
  memset(&this->specialisationParams,0,0xa0);
  return;
}

Assistant:

ModuleBase (ObjectType ot, CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ASTObject (ot, processorName), processorKeywordLocation (std::move (processorKeyword)), name (moduleName) {}